

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O3

void __thiscall wasm::Instrumenter::addSecondaryMemory(Instrumenter *this,size_t numFuncs)

{
  InstrumenterConfig *pIVar1;
  char *pcVar2;
  string_view sVar3;
  string_view *local_1b0;
  __single_object memory;
  
  if (this->config->storageKind == InSecondaryMemory) {
    if (((this->wasm->features).features & 0x8000) == 0) {
      Fatal::Fatal((Fatal *)&local_1b0);
      Fatal::operator<<((Fatal *)&local_1b0,
                        (char (*) [64])
                        "error: --in-secondary-memory requires multimemory to be enabled");
      Fatal::~Fatal((Fatal *)&local_1b0);
    }
    sVar3 = (string_view)
            Names::getValidMemoryName
                      (this->wasm,(Name)(this->config->secondaryMemoryName).super_IString.str);
    (this->secondaryMemory).super_IString.str = sVar3;
    pcVar2 = (char *)(numFuncs + 0xffff >> 0x10);
    local_1b0 = (string_view *)operator_new(0x58);
    local_1b0[1]._M_len = 0;
    local_1b0[1]._M_str = (char *)0x0;
    local_1b0[2]._M_len = 0;
    local_1b0[2]._M_str = (char *)0x0;
    local_1b0[3]._M_len = 0;
    local_1b0[3]._M_str = (char *)0x0;
    local_1b0[4]._M_len = 0;
    local_1b0[4]._M_str = (char *)0x0;
    *local_1b0 = sVar3;
    local_1b0[3]._M_str = pcVar2;
    local_1b0[4]._M_len = (size_t)pcVar2;
    *(undefined1 *)&local_1b0[4]._M_str = 1;
    local_1b0[5]._M_len = 2;
    pIVar1 = this->config;
    pcVar2 = (pIVar1->importNamespace).super_IString.str._M_str;
    local_1b0[1]._M_str = (char *)(pIVar1->importNamespace).super_IString.str._M_len;
    local_1b0[2]._M_len = (size_t)pcVar2;
    pcVar2 = (pIVar1->secondaryMemoryName).super_IString.str._M_str;
    local_1b0[2]._M_str = (char *)(pIVar1->secondaryMemoryName).super_IString.str._M_len;
    local_1b0[3]._M_len = (size_t)pcVar2;
    wasm::Module::addMemory((unique_ptr *)this->wasm);
    if (local_1b0 != (string_view *)0x0) {
      operator_delete(local_1b0,0x58);
    }
  }
  return;
}

Assistant:

void Instrumenter::addSecondaryMemory(size_t numFuncs) {
  if (config.storageKind != WasmSplitOptions::StorageKind::InSecondaryMemory) {
    // Don't need secondary memory
    return;
  }
  if (!wasm->features.hasMultiMemory()) {
    Fatal()
      << "error: --in-secondary-memory requires multimemory to be enabled";
  }

  secondaryMemory =
    Names::getValidMemoryName(*wasm, config.secondaryMemoryName);
  // Create a memory with enough pages to write into
  size_t pages = (numFuncs + Memory::kPageSize - 1) / Memory::kPageSize;
  auto mem = Builder::makeMemory(secondaryMemory, pages, pages, true);
  mem->module = config.importNamespace;
  mem->base = config.secondaryMemoryName;
  wasm->addMemory(std::move(mem));
}